

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::postsolve(Highs *this,HighsSolution *solution,HighsBasis *basis)

{
  undefined8 uVar1;
  Highs *in_RDX;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  HighsPresolveStatus unaff_retaddr;
  Highs *in_stack_00000008;
  HighsStatus return_status;
  bool can_run_postsolve;
  HighsBasis *in_stack_000005c8;
  HighsSolution *in_stack_000005d0;
  Highs *in_stack_000005d8;
  string *psVar2;
  bool local_59;
  string local_48 [36];
  undefined3 in_stack_ffffffffffffffdc;
  HighsStatus highs_return_status;
  HighsStatus local_4;
  
  local_59 = true;
  if ((((*(int *)(in_RDI + 0x1240) != -1) && (local_59 = true, *(int *)(in_RDI + 0x1240) != 0)) &&
      (local_59 = true, *(int *)(in_RDI + 0x1240) != 3)) &&
     ((local_59 = true, *(int *)(in_RDI + 0x1240) != 4 &&
      (local_59 = true, *(int *)(in_RDI + 0x1240) != 5)))) {
    local_59 = *(int *)(in_RDI + 0x1240) == 9;
  }
  highs_return_status = CONCAT13(local_59,in_stack_ffffffffffffffdc);
  if (local_59 == false) {
    psVar2 = local_48;
    presolveStatusToString_abi_cxx11_(in_stack_00000008,unaff_retaddr);
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                 "Cannot run postsolve with presolve status: %s\n",uVar1,in_R8,in_R9,psVar2);
    std::__cxx11::string::~string(local_48);
    local_4 = kWarning;
  }
  else {
    callRunPostsolve(in_stack_000005d8,in_stack_000005d0,in_stack_000005c8);
    local_4 = returnFromHighs(in_RDX,highs_return_status);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::postsolve(const HighsSolution& solution,
                             const HighsBasis& basis) {
  const bool can_run_postsolve =
      model_presolve_status_ == HighsPresolveStatus::kNotPresolved ||
      model_presolve_status_ == HighsPresolveStatus::kNotReduced ||
      model_presolve_status_ == HighsPresolveStatus::kReduced ||
      model_presolve_status_ == HighsPresolveStatus::kReducedToEmpty ||
      model_presolve_status_ == HighsPresolveStatus::kTimeout ||
      model_presolve_status_ == HighsPresolveStatus::kOutOfMemory;
  if (!can_run_postsolve) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Cannot run postsolve with presolve status: %s\n",
                 presolveStatusToString(model_presolve_status_).c_str());
    return HighsStatus::kWarning;
  }
  HighsStatus return_status = callRunPostsolve(solution, basis);
  return returnFromHighs(return_status);
}